

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O2

string * cmTargetPropertyComputer::ComputeLocationForBuild<cmTarget>(cmTarget *tgt)

{
  int iVar1;
  cmGlobalGenerator *this;
  cmGeneratorTarget *this_00;
  allocator<char> local_51;
  string local_50;
  string local_30;
  
  if (ComputeLocationForBuild<cmTarget>(cmTarget_const*)::loc_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&ComputeLocationForBuild<cmTarget>(cmTarget_const*)::loc_abi_cxx11_)
    ;
    if (iVar1 != 0) {
      ComputeLocationForBuild<cmTarget>(cmTarget_const*)::loc_abi_cxx11_._M_dataplus._M_p =
           (pointer)&ComputeLocationForBuild<cmTarget>(cmTarget_const*)::loc_abi_cxx11_.field_2;
      ComputeLocationForBuild<cmTarget>(cmTarget_const*)::loc_abi_cxx11_._M_string_length = 0;
      ComputeLocationForBuild<cmTarget>(cmTarget_const*)::loc_abi_cxx11_.field_2._M_local_buf[0] =
           '\0';
      __cxa_atexit(std::__cxx11::string::~string,
                   &ComputeLocationForBuild<cmTarget>(cmTarget_const*)::loc_abi_cxx11_,&__dso_handle
                  );
      __cxa_guard_release(&ComputeLocationForBuild<cmTarget>(cmTarget_const*)::loc_abi_cxx11_);
    }
  }
  if (((tgt->impl)._M_t.
       super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
       super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
       super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->IsImportedTarget == true) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"",&local_51);
    cmTarget::ImportedGetFullPath(&local_30,tgt,&local_50,RuntimeBinaryArtifact);
    std::__cxx11::string::operator=
              ((string *)&ComputeLocationForBuild<cmTarget>(cmTarget_const*)::loc_abi_cxx11_,
               (string *)&local_30);
    std::__cxx11::string::~string((string *)&local_30);
    std::__cxx11::string::~string((string *)&local_50);
  }
  else {
    this = cmTarget::GetGlobalGenerator(tgt);
    if (this->ConfigureDoneCMP0026AndCMP0024 == false) {
      cmGlobalGenerator::CreateGenerationObjects(this,AllTargets);
    }
    this_00 = cmGlobalGenerator::FindGeneratorTarget
                        (this,&((tgt->impl)._M_t.
                                super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                                .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                               Name);
    cmGeneratorTarget::GetLocationForBuild_abi_cxx11_(this_00);
    std::__cxx11::string::_M_assign
              ((string *)&ComputeLocationForBuild<cmTarget>(cmTarget_const*)::loc_abi_cxx11_);
  }
  return &ComputeLocationForBuild<cmTarget>(cmTarget_const*)::loc_abi_cxx11_;
}

Assistant:

const std::string& cmTargetPropertyComputer::ComputeLocationForBuild<cmTarget>(
  cmTarget const* tgt)
{
  static std::string loc;
  if (tgt->IsImported()) {
    loc = tgt->ImportedGetFullPath("", cmStateEnums::RuntimeBinaryArtifact);
    return loc;
  }

  cmGlobalGenerator* gg = tgt->GetGlobalGenerator();
  if (!gg->GetConfigureDoneCMP0026()) {
    gg->CreateGenerationObjects();
  }
  cmGeneratorTarget* gt = gg->FindGeneratorTarget(tgt->GetName());
  loc = gt->GetLocationForBuild();
  return loc;
}